

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8_t * google::protobuf::internal::InternalSerializeMapEntry
                    (FieldDescriptor *field,MapKey *key,MapValueConstRef *value,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  FieldDescriptor *field_00;
  FieldDescriptor *pFVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  uint32_t uVar5;
  int cached_size;
  uint uVar6;
  Descriptor *pDVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __n;
  MessageLite *pMVar11;
  uint64_t uVar12;
  int64_t iVar13;
  Nonnull<const_char_*> pcVar14;
  uint8_t *puVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  float fVar19;
  double dVar20;
  string_view s;
  
  pDVar7 = FieldDescriptor::message_type(field);
  if ((long)pDVar7->field_count_ < 1) {
    pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        (0,(long)pDVar7->field_count_,"index < field_count()");
  }
  else {
    pcVar14 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar14 != (Nonnull<const_char_*>)0x0) {
    InternalSerializeMapEntry();
LAB_002e4480:
    InternalSerializeMapEntry();
  }
  field_00 = pDVar7->fields_;
  pDVar7 = FieldDescriptor::message_type(field);
  if ((long)pDVar7->field_count_ < 2) {
    pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        (1,(long)pDVar7->field_count_,"index < field_count()");
  }
  else {
    pcVar14 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_002e4480;
  pFVar1 = pDVar7->fields_;
  sVar8 = MapKeyDataOnlyByteSize(field_00,key);
  sVar9 = MapValueRefDataOnlyByteSize(pFVar1 + 1,value);
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  uVar10 = sVar8 + sVar9 + 2;
  uVar16 = (ulong)(field->number_ * 8 + 2);
  if (0x7f < (uint)(field->number_ << 3)) {
    do {
      uVar6 = (uint)uVar16;
      *target = (byte)uVar16 | 0x80;
      uVar16 = uVar16 >> 7;
      target = target + 1;
    } while (0x3fff < uVar6);
  }
  *target = (byte)uVar16;
  pbVar17 = target + 1;
  if ((uint)uVar10 < 0x80) {
    uVar10 = uVar10 & 0xffffffff;
  }
  else {
    uVar16 = uVar10 & 0xffffffff;
    do {
      uVar6 = (uint)uVar10;
      *pbVar17 = (byte)uVar10 | 0x80;
      uVar10 = uVar16 >> 7;
      pbVar17 = pbVar17 + 1;
      uVar16 = uVar10;
    } while (0x3fff < uVar6);
  }
  *pbVar17 = (byte)uVar10;
  pbVar17 = SerializeMapKeyWithCachedSizes(field_00,key,pbVar17 + 1,stream);
  if (stream->end_ <= pbVar17) {
    pbVar17 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar17);
  }
  switch(pFVar1[1].type_) {
  case '\x01':
    dVar20 = MapValueConstRef::GetDoubleValue(value);
    *pbVar17 = 0x11;
    *(double *)(pbVar17 + 1) = dVar20;
    goto LAB_002e42d7;
  case '\x02':
    fVar19 = MapValueConstRef::GetFloatValue(value);
    *pbVar17 = 0x15;
    *(float *)(pbVar17 + 1) = fVar19;
    goto LAB_002e431c;
  case '\x03':
    uVar10 = MapValueConstRef::GetInt64Value(value);
    *pbVar17 = 0x10;
    pbVar18 = pbVar17 + 1;
    uVar16 = uVar10;
    if (uVar10 < 0x80) {
LAB_002e428f:
      pbVar18 = pbVar17 + 1;
    }
    else {
      do {
        *pbVar18 = (byte)uVar16 | 0x80;
        uVar10 = uVar16 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar2 = 0x3fff < uVar16;
        uVar16 = uVar10;
      } while (bVar2);
    }
    goto LAB_002e4292;
  case '\x04':
    uVar10 = MapValueConstRef::GetUInt64Value(value);
    *pbVar17 = 0x10;
    pbVar18 = pbVar17 + 1;
    uVar12 = uVar10;
    if (uVar10 < 0x80) goto LAB_002e428f;
    do {
      *pbVar18 = (byte)uVar12 | 0x80;
      uVar10 = uVar12 >> 7;
      pbVar18 = pbVar18 + 1;
      bVar2 = 0x3fff < uVar12;
      uVar12 = uVar10;
    } while (bVar2);
    goto LAB_002e4292;
  case '\x05':
    uVar6 = MapValueConstRef::GetInt32Value(value);
    *pbVar17 = 0x10;
    pbVar18 = pbVar17 + 1;
    uVar10 = (ulong)(int)uVar6;
    uVar16 = uVar10;
    if (uVar6 < 0x80) {
LAB_002e42b8:
      pbVar18 = pbVar17 + 1;
    }
    else {
      do {
        *pbVar18 = (byte)uVar16 | 0x80;
        uVar10 = uVar16 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar2 = 0x3fff < uVar16;
        uVar16 = uVar10;
      } while (bVar2);
    }
    goto LAB_002e42bb;
  case '\x06':
    uVar12 = MapValueConstRef::GetUInt64Value(value);
    goto LAB_002e42cd;
  case '\a':
    uVar5 = MapValueConstRef::GetUInt32Value(value);
    goto LAB_002e4312;
  case '\b':
    bVar2 = MapValueConstRef::GetBoolValue(value);
    *pbVar17 = 0x10;
    pbVar17[1] = bVar2;
    pbVar17 = pbVar17 + 2;
    break;
  case '\t':
  case '\f':
    s = MapValueConstRef::GetStringValue(value);
    __n = s._M_len;
    if ((0x7f < (long)__n) || ((long)(stream->end_ + (0xe - (long)pbVar17)) < (long)__n)) {
      puVar15 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,s,pbVar17);
      return puVar15;
    }
    *pbVar17 = 0x12;
    pbVar17[1] = (byte)s._M_len;
    memcpy(pbVar17 + 2,s._M_str,__n);
    pbVar17 = pbVar17 + __n + 2;
    break;
  case '\n':
    pMVar11 = &MapValueConstRef::GetMessageValue(value)->super_MessageLite;
    puVar15 = WireFormatLite::InternalWriteGroup(2,pMVar11,pbVar17,stream);
    return puVar15;
  case '\v':
    pMVar11 = &MapValueConstRef::GetMessageValue(value)->super_MessageLite;
    cached_size = MessageLite::GetCachedSize(pMVar11);
    puVar15 = WireFormatLite::InternalWriteMessage(2,pMVar11,cached_size,pbVar17,stream);
    return puVar15;
  case '\r':
    uVar4 = MapValueConstRef::GetUInt32Value(value);
    *pbVar17 = 0x10;
    pbVar18 = pbVar17 + 1;
    uVar5 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar18 = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar2);
    }
    goto LAB_002e413d;
  case '\x0e':
    uVar6 = MapValueConstRef::GetEnumValue(value);
    *pbVar17 = 0x10;
    pbVar18 = pbVar17 + 1;
    uVar10 = (ulong)(int)uVar6;
    uVar16 = uVar10;
    if (uVar6 < 0x80) goto LAB_002e42b8;
    do {
      *pbVar18 = (byte)uVar16 | 0x80;
      uVar10 = uVar16 >> 7;
      pbVar18 = pbVar18 + 1;
      bVar2 = 0x3fff < uVar16;
      uVar16 = uVar10;
    } while (bVar2);
LAB_002e42bb:
    *pbVar18 = (byte)uVar10;
    goto LAB_002e42bf;
  case '\x0f':
    uVar5 = MapValueConstRef::GetInt32Value(value);
LAB_002e4312:
    *pbVar17 = 0x15;
    *(uint32_t *)(pbVar17 + 1) = uVar5;
LAB_002e431c:
    pbVar17 = pbVar17 + 5;
    break;
  case '\x10':
    uVar12 = MapValueConstRef::GetInt64Value(value);
LAB_002e42cd:
    *pbVar17 = 0x11;
    *(uint64_t *)(pbVar17 + 1) = uVar12;
LAB_002e42d7:
    pbVar17 = pbVar17 + 9;
    break;
  case '\x11':
    iVar3 = MapValueConstRef::GetInt32Value(value);
    *pbVar17 = 0x10;
    pbVar18 = pbVar17 + 1;
    uVar4 = iVar3 >> 0x1f ^ iVar3 * 2;
    uVar6 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar18 = (byte)uVar6 | 0x80;
        uVar4 = uVar6 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar2);
    }
LAB_002e413d:
    *pbVar18 = (byte)uVar4;
    goto LAB_002e42bf;
  case '\x12':
    iVar13 = MapValueConstRef::GetInt64Value(value);
    *pbVar17 = 0x10;
    pbVar18 = pbVar17 + 1;
    uVar10 = iVar13 >> 0x3f ^ iVar13 * 2;
    uVar16 = uVar10;
    if (uVar10 < 0x80) goto LAB_002e428f;
    do {
      *pbVar18 = (byte)uVar16 | 0x80;
      uVar10 = uVar16 >> 7;
      pbVar18 = pbVar18 + 1;
      bVar2 = 0x3fff < uVar16;
      uVar16 = uVar10;
    } while (bVar2);
LAB_002e4292:
    *pbVar18 = (byte)uVar10;
LAB_002e42bf:
    pbVar17 = pbVar18 + 1;
  }
  return pbVar17;
}

Assistant:

static uint8_t* InternalSerializeMapEntry(const FieldDescriptor* field,
                                          const MapKey& key,
                                          const MapValueConstRef& value,
                                          uint8_t* target,
                                          io::EpsCopyOutputStream* stream) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  target = stream->EnsureSpace(target);
  target = WireFormatLite::WriteTagToArray(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(size, target);
  target = SerializeMapKeyWithCachedSizes(key_field, key, target, stream);
  target =
      SerializeMapValueRefWithCachedSizes(value_field, value, target, stream);
  return target;
}